

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

SUNErrCode N_VDotProdMulti_Serial(int nvec,N_Vector x,N_Vector *Y,sunrealtype *dotprods)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  sunrealtype sVar7;
  double dVar8;
  
  if (nvec == 1) {
    sVar7 = N_VDotProd_Serial(x,*Y);
    *dotprods = sVar7;
  }
  else {
    uVar3 = *x->content;
    uVar4 = 0;
    if ((long)uVar3 < 1) {
      uVar3 = uVar4;
    }
    uVar1 = *(ulong *)((long)x->content + 0x10);
    uVar5 = (ulong)(uint)nvec;
    if (nvec < 1) {
      uVar5 = uVar4;
    }
    for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
      lVar2 = *(long *)((long)Y[uVar4]->content + 0x10);
      dotprods[uVar4] = 0.0;
      dVar8 = 0.0;
      for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
        dVar8 = dVar8 + *(double *)(uVar1 + uVar6 * 8) * *(double *)(lVar2 + uVar6 * 8);
        dotprods[uVar4] = dVar8;
      }
    }
  }
  return 0;
}

Assistant:

SUNErrCode N_VDotProdMulti_Serial(int nvec, N_Vector x, N_Vector* Y,
                                  sunrealtype* dotprods)
{
  SUNFunctionBegin(x->sunctx);
  int i;
  sunindextype j, N;
  sunrealtype* xd = NULL;
  sunrealtype* yd = NULL;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* should have called N_VDotProd */
  if (nvec == 1)
  {
    dotprods[0] = N_VDotProd_Serial(x, Y[0]);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* get vector length and data array */
  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  /* compute multiple dot products */
  for (i = 0; i < nvec; i++)
  {
    yd          = NV_DATA_S(Y[i]);
    dotprods[i] = ZERO;
    for (j = 0; j < N; j++) { dotprods[i] += xd[j] * yd[j]; }
  }

  return SUN_SUCCESS;
}